

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::ensure_valid_name(CompilerMSL *this,string *name,string *pfx)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *pfx_local;
  string *name_local;
  CompilerMSL *this_local;
  
  uVar2 = ::std::__cxx11::string::size();
  if ((1 < uVar2) &&
     (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)pfx), *pcVar3 == '_')) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)pfx);
    iVar1 = isdigit((int)*pcVar3);
    if (iVar1 != 0) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       in_RCX);
      return this;
    }
  }
  ::std::__cxx11::string::string((string *)this,(string *)pfx);
  return this;
}

Assistant:

string CompilerMSL::ensure_valid_name(string name, string pfx)
{
	return (name.size() >= 2 && name[0] == '_' && isdigit(name[1])) ? (pfx + name) : name;
}